

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# satSolver2.c
# Opt level: O0

int clause2_create_new(sat_solver2 *s,lit *begin,lit *end,int learnt,int proof_id)

{
  int nSize;
  int iVar1;
  uint h_00;
  uint uVar2;
  int iVar3;
  lit lVar4;
  clause *c_00;
  veci *pvVar5;
  int size;
  int h;
  clause *c;
  int proof_id_local;
  int learnt_local;
  lit *end_local;
  lit *begin_local;
  sat_solver2 *s_local;
  
  nSize = (int)((long)end - (long)begin >> 2);
  if ((0 < nSize) && (*begin < 0)) {
    __assert_fail("size < 1 || begin[0] >= 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/sat/bsat/satSolver2.c"
                  ,0x19c,"int clause2_create_new(sat_solver2 *, lit *, lit *, int, int)");
  }
  if ((1 < nSize) && (begin[1] < 0)) {
    __assert_fail("size < 2 || begin[1] >= 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/sat/bsat/satSolver2.c"
                  ,0x19d,"int clause2_create_new(sat_solver2 *, lit *, lit *, int, int)");
  }
  if ((0 < nSize) && (iVar1 = lit_var(*begin), s->size <= iVar1)) {
    __assert_fail("size < 1 || lit_var(begin[0]) < s->size",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/sat/bsat/satSolver2.c"
                  ,0x19e,"int clause2_create_new(sat_solver2 *, lit *, lit *, int, int)");
  }
  if ((1 < nSize) && (iVar1 = lit_var(begin[1]), s->size <= iVar1)) {
    __assert_fail("size < 2 || lit_var(begin[1]) < s->size",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/sat/bsat/satSolver2.c"
                  ,0x19f,"int clause2_create_new(sat_solver2 *, lit *, lit *, int, int)");
  }
  h_00 = Sat_MemAppend(&s->Mem,begin,nSize,learnt,1);
  if ((h_00 & 1) != 0) {
    __assert_fail("!(h & 1)",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/sat/bsat/satSolver2.c"
                  ,0x1a2,"int clause2_create_new(sat_solver2 *, lit *, lit *, int, int)");
  }
  c_00 = clause2_read(s,h_00);
  if (learnt == 0) {
    uVar2 = clause_id(c_00);
    if (uVar2 != (s->stats).clauses) {
      __assert_fail("clause_id(c) == (int)s->stats.clauses",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/sat/bsat/satSolver2.c"
                    ,0x1b7,"int clause2_create_new(sat_solver2 *, lit *, lit *, int, int)");
    }
    (s->stats).clauses = (s->stats).clauses + 1;
    (s->stats).clauses_literals = (long)nSize + (s->stats).clauses_literals;
  }
  else {
    if ((s->pPrf1 != (Vec_Set_t *)0x0) && (proof_id == 0)) {
      __assert_fail("proof_id",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/sat/bsat/satSolver2.c"
                    ,0x1a7,"int clause2_create_new(sat_solver2 *, lit *, lit *, int, int)");
    }
    uVar2 = sat_clause_compute_lbd(s,c_00);
    *c_00 = (clause)((uint)*c_00 & 0xfffff807 | (uVar2 & 0xff) << 3);
    iVar1 = clause_id(c_00);
    iVar3 = veci_size(&s->act_clas);
    if (iVar1 != iVar3) {
      __assert_fail("clause_id(c) == veci_size(&s->act_clas)",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/sat/bsat/satSolver2.c"
                    ,0x1a9,"int clause2_create_new(sat_solver2 *, lit *, lit *, int, int)");
    }
    if ((s->pPrf1 != (Vec_Set_t *)0x0) || (s->pInt2 != (Int2_Man_t *)0x0)) {
      veci_push(&s->claProofs,proof_id);
    }
    veci_push(&s->act_clas,0);
    if (2 < nSize) {
      act_clause2_bump(s,c_00);
    }
    (s->stats).learnts = (s->stats).learnts + 1;
    (s->stats).learnts_literals = (long)nSize + (s->stats).learnts_literals;
    s->hLearntLast = h_00;
  }
  if (1 < nSize) {
    lVar4 = lit_neg(*begin);
    pvVar5 = solver2_wlist(s,lVar4);
    veci_push(pvVar5,h_00);
    lVar4 = lit_neg(begin[1]);
    pvVar5 = solver2_wlist(s,lVar4);
    veci_push(pvVar5,h_00);
  }
  return h_00;
}

Assistant:

static int clause2_create_new(sat_solver2* s, lit* begin, lit* end, int learnt, int proof_id )
{
    clause* c;
    int h, size = end - begin;
    assert(size < 1 || begin[0] >= 0);
    assert(size < 2 || begin[1] >= 0);
    assert(size < 1 || lit_var(begin[0]) < s->size);
    assert(size < 2 || lit_var(begin[1]) < s->size);
    // create new clause
    h = Sat_MemAppend( &s->Mem, begin, size, learnt, 1 );
    assert( !(h & 1) );
    c = clause2_read( s, h );
    if (learnt)
    {
        if ( s->pPrf1 )
            assert( proof_id );
        c->lbd = sat_clause_compute_lbd( s, c );
        assert( clause_id(c) == veci_size(&s->act_clas) );
        if ( s->pPrf1 || s->pInt2 )
            veci_push(&s->claProofs, proof_id);
//        veci_push(&s->act_clas, (1<<10));
        veci_push(&s->act_clas, 0);
        if ( size > 2 )
            act_clause2_bump( s,c );
        s->stats.learnts++;
        s->stats.learnts_literals += size;
        // remember the last one
        s->hLearntLast = h;
    }
    else
    {
        assert( clause_id(c) == (int)s->stats.clauses );
        s->stats.clauses++;
        s->stats.clauses_literals += size;
    }
    // watch the clause
    if ( size > 1 )
    {
        veci_push(solver2_wlist(s,lit_neg(begin[0])),h);
        veci_push(solver2_wlist(s,lit_neg(begin[1])),h);
    }
    return h;
}